

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_memory.c
# Opt level: O2

int64_t memory_read_seek(archive *a,void *client_data,int64_t offset,int whence)

{
  ulong uVar1;
  ulong uVar2;
  int64_t iStack_8;
  
  if (whence == 2) {
    uVar2 = offset + *(long *)((long)client_data + 0x10);
  }
  else if (whence == 1) {
    uVar2 = offset + *(long *)((long)client_data + 8);
  }
  else {
    if (whence != 0) {
      return -0x1e;
    }
    uVar2 = offset + *client_data;
  }
  *(ulong *)((long)client_data + 8) = uVar2;
  uVar1 = *client_data;
  iStack_8 = uVar2 - uVar1;
  if ((uVar2 < uVar1) || (uVar1 = *(ulong *)((long)client_data + 0x10), uVar1 < uVar2)) {
    *(ulong *)((long)client_data + 8) = uVar1;
    iStack_8 = -0x19;
  }
  return iStack_8;
}

Assistant:

static int64_t
memory_read_seek(struct archive *a, void *client_data, int64_t offset, int whence)
{
	struct read_memory_data *mine = (struct read_memory_data *)client_data;

	(void)a; /* UNUSED */
	switch (whence) {
	case SEEK_SET:
		mine->p = mine->start + offset;
		break;
	case SEEK_CUR:
		mine->p += offset;
		break;
	case SEEK_END:
		mine->p = mine->end + offset;
		break;
	default:
		return ARCHIVE_FATAL;
	}
	if (mine->p < mine->start) {
		mine->p = mine->start;
		return ARCHIVE_FAILED;
	}
	if (mine->p > mine->end) {
		mine->p = mine->end;
		return ARCHIVE_FAILED;
	}
	return (mine->p - mine->start);
}